

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aprog.c
# Opt level: O2

void aprog_set(AREA_DATA_conflict *area,char *progtype,char *name)

{
  APROG_DATA *pAVar1;
  long lVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  string_view fmt;
  
  lVar2 = -0x10;
  do {
    lVar5 = lVar2;
    if (lVar5 + 0x20 == 0x110) {
      fmt._M_str = "Load_improgs: \'A\': Function not found for area {}.";
      fmt._M_len = 0x32;
      CLogger::Warn<char*&>((CLogger *)&RS.field_0x140,fmt,&area->name);
      return;
    }
    bVar3 = str_cmp(*(char **)((long)&aprog_table[0].owner + lVar5),name);
    lVar2 = lVar5 + 0x20;
  } while (bVar3);
  bVar3 = str_cmp(progtype,"pulse_prog");
  if (bVar3) {
    bVar3 = str_cmp(progtype,"reset_prog");
    if (bVar3) {
      bVar3 = str_cmp(progtype,"sun_prog");
      if (bVar3) {
        bVar3 = str_cmp(progtype,"tick_prog");
        if (bVar3) {
          bVar3 = str_cmp(progtype,"aggress_prog");
          if (bVar3) {
            bVar3 = str_cmp(progtype,"myell_prog");
            if (!bVar3) {
              pAVar1 = area->aprogs;
              pAVar1->myell_prog = *(APROG_FUN_MYELL **)((long)&aprog_table[1].type + lVar5);
              free_pstring(pAVar1->myell_name);
              pcVar4 = palloc_string(name);
              area->aprogs->myell_name = pcVar4;
              *(byte *)area->progtypes = (byte)area->progtypes[0] | 0x20;
            }
          }
          else {
            pAVar1 = area->aprogs;
            pAVar1->aggress_prog = *(APROG_FUN_AGGRESS **)((long)&aprog_table[1].type + lVar5);
            free_pstring(pAVar1->aggress_name);
            pcVar4 = palloc_string(name);
            area->aprogs->aggress_name = pcVar4;
            *(byte *)area->progtypes = (byte)area->progtypes[0] | 0x10;
          }
        }
        else {
          pAVar1 = area->aprogs;
          pAVar1->tick_prog = *(undefined1 **)((long)&aprog_table[1].type + lVar5);
          free_pstring(pAVar1->tick_name);
          pcVar4 = palloc_string(name);
          area->aprogs->tick_name = pcVar4;
          *(byte *)area->progtypes = (byte)area->progtypes[0] | 8;
        }
      }
      else {
        pAVar1 = area->aprogs;
        pAVar1->sun_prog = *(undefined1 **)((long)&aprog_table[1].type + lVar5);
        free_pstring(pAVar1->sun_name);
        pcVar4 = palloc_string(name);
        area->aprogs->sun_name = pcVar4;
        *(byte *)area->progtypes = (byte)area->progtypes[0] | 4;
      }
    }
    else {
      pAVar1 = area->aprogs;
      pAVar1->reset_prog = *(undefined1 **)((long)&aprog_table[1].type + lVar5);
      free_pstring(pAVar1->reset_name);
      pcVar4 = palloc_string(name);
      area->aprogs->reset_name = pcVar4;
      *(byte *)area->progtypes = (byte)area->progtypes[0] | 2;
    }
  }
  else {
    pAVar1 = area->aprogs;
    pAVar1->pulse_prog = *(undefined1 **)((long)&aprog_table[1].type + lVar5);
    free_pstring(pAVar1->pulse_name);
    pcVar4 = palloc_string(name);
    area->aprogs->pulse_name = pcVar4;
    *(byte *)area->progtypes = (byte)area->progtypes[0] | 1;
  }
  return;
}

Assistant:

void aprog_set(AREA_DATA *area, const char *progtype, const char *name)
{
	int i;

	for (i = 0; aprog_table[i].name; i++)
	{
		if (!str_cmp(aprog_table[i].name, name))
			break;
	}

	if (!aprog_table[i].name)
	{
		RS.Logger.Warn("Load_improgs: 'A': Function not found for area {}.", area->name);
		return;
	}

	// IF YOU ADD A NEW TYPE ALSO PUT IT IN DB.C DO_ADUMP!

	if (!str_cmp(progtype, "pulse_prog"))
	{
		area->aprogs->pulse_prog = (APROG_FUN_PULSE *)aprog_table[i].function;
		free_pstring(area->aprogs->pulse_name);
		area->aprogs->pulse_name = palloc_string(name);
		SET_BIT(area->progtypes, APROG_PULSE);
		return;
	}

	if (!str_cmp(progtype, "reset_prog"))
	{
		area->aprogs->reset_prog = (APROG_FUN_RESET *)aprog_table[i].function;
		free_pstring(area->aprogs->reset_name);
		area->aprogs->reset_name = palloc_string(name);
		SET_BIT(area->progtypes, APROG_RESET);
		return;
	}

	if (!str_cmp(progtype, "sun_prog"))
	{
		area->aprogs->sun_prog = (APROG_FUN_SUN *)aprog_table[i].function;
		free_pstring(area->aprogs->sun_name);
		area->aprogs->sun_name = palloc_string(name);
		SET_BIT(area->progtypes, APROG_SUN);
		return;
	}

	if (!str_cmp(progtype, "tick_prog"))
	{
		area->aprogs->tick_prog = (APROG_FUN_TICK *)aprog_table[i].function;

		free_pstring(area->aprogs->tick_name);
		area->aprogs->tick_name = palloc_string(name);
		SET_BIT(area->progtypes, APROG_TICK);
		return;
	}

	if (!str_cmp(progtype, "aggress_prog"))
	{
		area->aprogs->aggress_prog = (APROG_FUN_AGGRESS *)aprog_table[i].function;
		free_pstring(area->aprogs->aggress_name);
		area->aprogs->aggress_name = palloc_string(name);
		SET_BIT(area->progtypes, APROG_AGGRESS);
		return;
	}

	if (!str_cmp(progtype, "myell_prog"))
	{
		area->aprogs->myell_prog = (APROG_FUN_MYELL *)aprog_table[i].function;
		free_pstring(area->aprogs->myell_name);
		area->aprogs->myell_name = palloc_string(name);
		SET_BIT(area->progtypes, APROG_MYELL);
		return;
	}
}